

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  int iVar1;
  Vec_Ptr_t *vFrontier;
  Ivy_Obj_t *pNode;
  Ivy_Obj_t *vSuper;
  void *pvVar2;
  int i;
  
  if (pOld == (Ivy_Obj_t *)0x0 && pNew == (Ivy_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x9f6,"void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)"
                 );
  }
  if (((pOld == (Ivy_Obj_t *)0x0) || (pOld->pNextFan1 != (Ivy_Obj_t *)0x0)) &&
     ((pNew == (Ivy_Obj_t *)0x0 || (pNew->pNextFan1 != (Ivy_Obj_t *)0x0)))) {
    return;
  }
  vFrontier = Vec_PtrAlloc(100);
  if (pOld != (Ivy_Obj_t *)0x0) {
    Ivy_FraigObjAddToFrontier(p,pOld,vFrontier);
  }
  if (pNew != (Ivy_Obj_t *)0x0) {
    Ivy_FraigObjAddToFrontier(p,pNew,vFrontier);
  }
  i = 0;
  while( true ) {
    if (vFrontier->nSize <= i) {
      Vec_PtrFree(vFrontier);
      sat_solver_simplify(p->pSat);
      return;
    }
    pNode = (Ivy_Obj_t *)Vec_PtrEntry(vFrontier,i);
    if (*(int *)&pNode->pNextFan0 == 0) {
      __assert_fail("Ivy_ObjSatNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                    ,0xa02,
                    "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    if (pNode->pNextFan1 != (Ivy_Obj_t *)0x0) {
      __assert_fail("Ivy_ObjFaninVec(pNode) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                    ,0xa03,
                    "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    iVar1 = Ivy_ObjIsMuxType(pNode);
    if (iVar1 == 0) {
      vSuper = (Ivy_Obj_t *)Ivy_FraigCollectSuper(pNode,1);
      for (iVar1 = 0; iVar1 < vSuper->TravId; iVar1 = iVar1 + 1) {
        pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)vSuper,iVar1);
        Ivy_FraigObjAddToFrontier(p,(Ivy_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe),vFrontier);
      }
      Ivy_FraigAddClausesSuper(p,pNode,(Vec_Ptr_t *)vSuper);
    }
    else {
      vSuper = (Ivy_Obj_t *)Vec_PtrAlloc(4);
      Vec_PtrPushUnique((Vec_Ptr_t *)vSuper,
                        (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                                0xfffffffffffffffe));
      Vec_PtrPushUnique((Vec_Ptr_t *)vSuper,
                        (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                                0xfffffffffffffffe));
      Vec_PtrPushUnique((Vec_Ptr_t *)vSuper,
                        (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x18) &
                                0xfffffffffffffffe));
      Vec_PtrPushUnique((Vec_Ptr_t *)vSuper,
                        (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x18) &
                                0xfffffffffffffffe));
      for (iVar1 = 0; iVar1 < vSuper->TravId; iVar1 = iVar1 + 1) {
        pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)vSuper,iVar1);
        Ivy_FraigObjAddToFrontier(p,(Ivy_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe),vFrontier);
      }
      Ivy_FraigAddClausesMux(p,pNode);
    }
    if (vSuper->TravId < 2) break;
    pNode->pNextFan1 = vSuper;
    i = i + 1;
  }
  __assert_fail("Vec_PtrSize(vFanins) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0xa16,"void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_FraigNodeAddToSolver( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Ivy_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Ivy_ObjFaninVec(pOld)) && (!pNew || Ivy_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Ivy_FraigObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Ivy_FraigObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ivy_ObjSatNum(pNode) );
        assert( Ivy_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Ivy_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Ivy_FraigCollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Ivy_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
    sat_solver_simplify( p->pSat );
}